

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O3

void __thiscall
kj::_::anon_unknown_0::MockExceptionCallback::logMessage
          (MockExceptionCallback *this,LogSeverity severity,char *file,int line,int contextDepth,
          String *text)

{
  string *this_00;
  size_t sVar1;
  ArrayDisposer *pAVar2;
  char *__s;
  char *pcVar3;
  undefined4 uStack_68;
  int contextDepth_local;
  int line_local;
  LogSeverity severity_local;
  String local_58;
  char *file_local;
  char *local_38;
  undefined8 local_30;
  StringPtr local_28;
  
  local_38 = "To symbolize stack traces, install it in your $PATH";
  local_30 = 0x34;
  local_28.content.size_ = (text->content).size_;
  if (local_28.content.size_ == 0) {
    local_28.content.ptr = "";
  }
  else {
    local_28.content.ptr = (text->content).ptr;
  }
  local_28.content.size_ = local_28.content.size_ + (local_28.content.size_ == 0);
  contextDepth_local = contextDepth;
  line_local = line;
  severity_local = severity;
  file_local = file;
  StringPtr::find((StringPtr *)&local_58,&local_28);
  if ((char)local_58.content.ptr == '\0') {
    this_00 = &this->text;
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (this_00,"log message: ");
    str<char_const*&,char_const(&)[2],int&,char_const(&)[3],int&,char_const(&)[3],kj::LogSeverity&,char_const(&)[3],kj::String>
              (&local_58,(kj *)&file_local,(char **)0x1d864d,(char (*) [2])&line_local,(int *)":+",
               (char (*) [3])&contextDepth_local,(int *)0x1db3fa,(char (*) [3])&severity_local,
               (LogSeverity *)0x1db3fa,(char (*) [3])text,
               (String *)CONCAT44(contextDepth_local,uStack_68));
    pcVar3 = (text->content).ptr;
    if (pcVar3 != (char *)0x0) {
      sVar1 = (text->content).size_;
      pAVar2 = (text->content).disposer;
      (text->content).ptr = (char *)0x0;
      (text->content).size_ = 0;
      (**pAVar2->_vptr_ArrayDisposer)(pAVar2,pcVar3,1,sVar1,sVar1,0);
    }
    __s = (char *)CONCAT71(local_58.content.ptr._1_7_,(char)local_58.content.ptr);
    (text->content).ptr = __s;
    (text->content).size_ = local_58.content.size_;
    (text->content).disposer = local_58.content.disposer;
    pcVar3 = __s + (local_58.content.size_ - 1);
    if (local_58.content.size_ == 0) {
      __s = (char *)0x0;
    }
    if (local_58.content.size_ == 0) {
      pcVar3 = (char *)0x0;
    }
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              (this_00,(this->text)._M_string_length,0,__s,(long)pcVar3 - (long)__s);
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (this_00,"\n");
  }
  return;
}

Assistant:

void logMessage(LogSeverity severity, const char* file, int line, int contextDepth,
                  String&& text) override {
    if (text.contains("To symbolize stack traces, install it in your $PATH")) {
      // Ignore warning about LLVM_SYMBOLIZER not being available.
      return;
    }

    this->text += "log message: ";
    text = str(file, ":", line, ":+", contextDepth, ": ", severity, ": ", mv(text));
    this->text.append(text.begin(), text.end());
    this->text.append("\n");
  }